

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O3

void __thiscall RenX_ChatLogPlugin::PrepFile(RenX_ChatLogPlugin *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string file_name;
  string current_date;
  string full_date;
  size_type *local_98;
  size_type local_90;
  size_type local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar3 = (char *)getTimeFormat("%F");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,pcVar3,(allocator<char> *)&local_58);
  pcVar3 = (char *)getTimeFormat("%c");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,pcVar3,(allocator<char> *)&local_98);
  if (local_78._M_string_length == (this->last_date)._M_string_length) {
    if (local_78._M_string_length == 0) goto LAB_00107628;
    iVar2 = bcmp(local_78._M_dataplus._M_p,(this->last_date)._M_dataplus._M_p,
                 local_78._M_string_length);
    if (iVar2 == 0) goto LAB_00107628;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->last_date,&local_78);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::fstream::close();
  }
  std::operator+(&local_38,"ChatLog_",&local_78);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_38,".log");
  local_98 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98 == paVar6) {
    local_88 = paVar6->_M_allocated_capacity;
    uStack_80 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_98 = &local_88;
  }
  else {
    local_88 = paVar6->_M_allocated_capacity;
  }
  local_90 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::fstream::open((string *)&this->fs,(_Ios_Openmode)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0xd0,"Session Start: ",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0xd0,(char *)local_58,local_50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
LAB_00107628:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RenX_ChatLogPlugin::PrepFile()
{
	// Check if date changed (Format: YYYY-MM-DD)
	std::string current_date = getTimeFormat("%F");
	std::string full_date = getTimeFormat("%c");

	if (current_date == last_date) {
		return;
	}

	last_date = current_date;

	// Close any currently opened file

	if (fs.is_open()) {
		fs.close();
	}

	// Open new file

	std::string file_name = "ChatLog_" + current_date + ".log";
	fs.open(file_name, std::fstream::out | std::fstream::app);

	fs << "Session Start: "
		<< full_date
		<< std::endl;
}